

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlSetupParserForBuffer(xmlParserCtxtPtr ctxt,xmlChar *buffer,char *filename)

{
  int iVar1;
  xmlParserInputPtr value;
  
  if (buffer != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    xmlClearParserCtxt(ctxt);
    value = xmlCtxtNewInputFromString(ctxt,filename,(char *)buffer,(char *)0x0,0);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlSetupParserForBuffer(xmlParserCtxtPtr ctxt, const xmlChar* buffer,
                             const char* filename)
{
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (buffer == NULL))
        return;

    xmlClearParserCtxt(ctxt);

    input = xmlCtxtNewInputFromString(ctxt, filename, (const char *) buffer,
                                      NULL, 0);
    if (input == NULL)
        return;
    if (xmlCtxtPushInput(ctxt, input) < 0)
        xmlFreeInputStream(input);
}